

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

void __thiscall
gl3cts::TransformFeedback::QueryVertexSeparate::draw
          (QueryVertexSeparate *this,GLuint primitive_case)

{
  deUint32 dVar1;
  long lVar2;
  
  lVar2 = (**(code **)(**(long **)(*(long *)(&(this->super_CaptureVertexSeparate).field_0x78 +
                                            (long)(this->super_CaptureVertexSeparate).
                                                  _vptr_CaptureVertexSeparate[-3]) + 8) + 0x18))();
  (**(code **)(lVar2 + 0x20))(0x8c88,*(undefined4 *)&(this->super_CaptureVertexSeparate).field_0x14)
  ;
  dVar1 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar1,"glBeginQuery call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xfb1);
  CaptureVertexInterleaved::draw
            ((CaptureVertexInterleaved *)
             ((long)&(this->super_CaptureVertexSeparate)._vptr_CaptureVertexSeparate +
             (long)(this->super_CaptureVertexSeparate)._vptr_CaptureVertexSeparate[-3]),
             primitive_case);
  (**(code **)(lVar2 + 0x628))(0x8c88);
  dVar1 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar1,"glEndQuery call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xfb6);
  return;
}

Assistant:

void gl3cts::TransformFeedback::QueryVertexSeparate::draw(glw::GLuint primitive_case)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.beginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, m_query_object);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginQuery call failed.");

	gl3cts::TransformFeedback::CaptureVertexSeparate::draw(primitive_case);

	gl.endQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndQuery call failed.");
}